

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O1

int ffgtrm(fitsfile *gfptr,int rmopt,int *status)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long nmembers;
  int hdutype;
  HDUtracker HDU;
  long local_5df8;
  int local_5dec;
  HDUtracker local_5de8;
  
  local_5df8 = 0;
  iVar2 = *status;
  if (iVar2 == 0) {
    if (rmopt == 3) {
      local_5de8.nHDU = 0;
      iVar2 = fftsad(gfptr,&local_5de8,(int *)0x0,(char *)0x0);
      *status = iVar2;
      iVar2 = ffgtrmr(gfptr,&local_5de8,status);
      *status = iVar2;
      lVar4 = (long)local_5de8.nHDU;
      if (0 < lVar4) {
        lVar3 = 0;
        do {
          free(local_5de8.filename[lVar3]);
          free(local_5de8.newFilename[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar4 != lVar3);
      }
    }
    else if (rmopt == 0) {
      iVar2 = ffgtnm(gfptr,&local_5df8,status);
      *status = iVar2;
      lVar4 = local_5df8;
      if (0 < local_5df8) {
        do {
          if (*status != 0) break;
          iVar2 = ffgmrm(gfptr,lVar4,1,status);
          *status = iVar2;
          bVar1 = 1 < lVar4;
          lVar4 = lVar4 + -1;
        } while (bVar1);
      }
    }
    else {
      *status = 0x15b;
      ffpmsg("Invalid value for the rmopt parameter specified (ffgtrm)");
    }
    iVar2 = ffgmul(gfptr,0,status);
    *status = iVar2;
    iVar2 = ffdhdu(gfptr,&local_5dec,status);
    *status = iVar2;
  }
  return iVar2;
}

Assistant:

int ffgtrm(fitsfile *gfptr,  /* FITS file pointer to group                   */
	   int       rmopt,  /* code specifying if member
				elements are to be deleted:
				OPT_RM_GPT ==> remove only group table
				OPT_RM_ALL ==> recursively remove members
				and their members (if groups)                */
	   int      *status) /* return status code                           */
	    
/*
  remove a grouping table, and optionally all its members. Any groups 
  containing the grouping table are updated, and all members (if not 
  deleted) have their GRPIDn and GRPLCn keywords updated accordingly. 
  If the (deleted) members are members of another grouping table then those
  tables are also updated. The CHDU of the FITS file pointed to by gfptr must 
  be positioned to the grouping table to be deleted.
*/

{
  int hdutype;

  long i;
  long nmembers = 0;

  HDUtracker HDU;
  

  if(*status != 0) return(*status);

  /*
     remove the grouping table depending upon the rmopt parameter
  */

  switch(rmopt)
    {

    case OPT_RM_GPT:

      /*
	 for this option, the grouping table is deleted, but the member
	 HDUs remain; in this case we only have to remove each member from
	 the grouping table by calling fits_remove_member() with the
	 OPT_RM_ENTRY option
      */

      /* get the number of members contained by this table */

      *status = fits_get_num_members(gfptr,&nmembers,status);

      /* loop over all grouping table members and remove them */

      for(i = nmembers; i > 0 && *status == 0; --i)
	*status = fits_remove_member(gfptr,i,OPT_RM_ENTRY,status);
      
	break;

    case OPT_RM_ALL:

      /*
	for this option the entire Group is deleted -- this includes all
	members and their members (if grouping tables themselves). Call 
	the recursive form of this function to perform the removal.
      */

      /* add the current grouping table to the HDUtracker struct */

      HDU.nHDU = 0;

      *status = fftsad(gfptr,&HDU,NULL,NULL);

      /* call the recursive group remove function */

      *status = ffgtrmr(gfptr,&HDU,status);

      /* free the memory allocated to the HDUtracker struct */

      for(i = 0; i < HDU.nHDU; ++i)
	{
	  free(HDU.filename[i]);
	  free(HDU.newFilename[i]);
	}

      break;

    default:
      
      *status = BAD_OPTION;
      ffpmsg("Invalid value for the rmopt parameter specified (ffgtrm)");
      break;

     }

  /*
     if all went well then unlink and delete the grouping table HDU
  */

  *status = ffgmul(gfptr,0,status);

  *status = fits_delete_hdu(gfptr,&hdutype,status);
      
  return(*status);
}